

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleLeggedOdometry.cpp
# Opt level: O3

bool __thiscall
iDynTree::SimpleLeggedOdometry::updateKinematics
          (SimpleLeggedOdometry *this,JointPosDoubleArray *jointPos)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  Transform local_80 [96];
  
  if (this->m_isModelValid == false) {
    pcVar3 = "model not valid";
  }
  else {
    cVar1 = iDynTree::JointPosDoubleArray::isConsistent((Model *)jointPos);
    if (cVar1 != '\0') {
      iDynTree::Transform::Identity();
      bVar2 = (bool)iDynTree::ForwardPositionKinematics
                              (&this->m_model,&this->m_traversal,local_80,(VectorDynSize *)jointPos,
                               &this->m_base_H_link);
      this->m_kinematicsUpdated = bVar2;
      return bVar2;
    }
    pcVar3 = "error in size of input jointPos";
  }
  iDynTree::reportError("SimpleLeggedOdometry","updateKinematics",pcVar3);
  return false;
}

Assistant:

bool SimpleLeggedOdometry::updateKinematics(JointPosDoubleArray& jointPos)
{
    if( !m_isModelValid )
    {
        reportError("SimpleLeggedOdometry",
                    "updateKinematics","model not valid");
        return false;
    }

    if( !jointPos.isConsistent(m_model) )
    {
        reportError("SimpleLeggedOdometry",
                    "updateKinematics","error in size of input jointPos");
        return false;
    }

    bool ok = ForwardPositionKinematics(m_model,m_traversal,
                                        Transform::Identity(),jointPos,
                                        m_base_H_link);

    m_kinematicsUpdated = ok;

    return ok;
}